

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateMemInit
          (Lowerer *this,RegOpnd *opnd,int32 offset,int32 value,Instr *insertBeforeInstr,
          bool isZeroed)

{
  Func *func_00;
  IndirOpnd *dst;
  IntConstOpnd *src;
  IRType local_41;
  Func *func;
  IRType type;
  bool isZeroed_local;
  Instr *insertBeforeInstr_local;
  int32 value_local;
  int32 offset_local;
  RegOpnd *opnd_local;
  Lowerer *this_local;
  
  func._6_1_ = TyInt32;
  if (isZeroed) {
    if (value == 0) {
      return;
    }
    if ((0 < value) && (value < 0x10000)) {
      local_41 = TyUint8;
      if (0xff < value) {
        local_41 = TyUint16;
      }
      func._6_1_ = local_41;
    }
  }
  func_00 = this->m_func;
  dst = IR::IndirOpnd::New(opnd,offset,func._6_1_,func_00,false);
  src = IR::IntConstOpnd::New((long)value,func._6_1_,func_00,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  return;
}

Assistant:

void
Lowerer::GenerateMemInit(IR::RegOpnd * opnd, int32 offset, int32 value, IR::Instr * insertBeforeInstr, bool isZeroed)
{
    IRType type = TyInt32;
    if (isZeroed)
    {
        if (value == 0)
        {
            // Recycler memory are zero initialized
            return;
        }

        if (value > 0 && value <= USHORT_MAX)
        {
            // Recycler memory are zero initialized, so we can just initialize the 8 or 16 bits of value
            type = (value <= UCHAR_MAX)? TyUint8 : TyUint16;
        }
    }
    Func * func = this->m_func;
    InsertMove(IR::IndirOpnd::New(opnd, offset, type, func), IR::IntConstOpnd::New(value, type, func), insertBeforeInstr);
}